

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
::Matches(TypedExpectation<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  TypedExpectation<ot::commissioner::Error_(unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
  *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TupleMatches<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>>,std::tuple<unsigned_short,std::chrono::duration<long,std::ratio<1l,1000l>>>>
                    ((tuple<testing::Matcher<unsigned_short>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                      *)(this + 0xf0),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_&>
               ::Matches((MatcherBase<const_std::tuple<unsigned_short,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_&>
                          *)(this + 0x120),args);
  }
  return local_19;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }